

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O0

void ggml_opt_epoch_callback_progress_bar
               (bool train,ggml_opt_context_t opt_ctx,ggml_opt_dataset_t dataset,
               ggml_opt_result_t result,int64_t ibatch,int64_t ibatch_max,int64_t t_start_us)

{
  long lVar1;
  ggml_tensor *pgVar2;
  int64_t iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ggml_opt_context_t in_RSI;
  byte in_DIL;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  int64_t t_eta_m;
  int64_t t_eta_h;
  int64_t t_eta_s;
  int64_t t_eta_us;
  int64_t t_ibatch_m;
  int64_t t_ibatch_h;
  int64_t t_ibatch_s;
  int64_t t_ibatch_us;
  double accuracy_unc;
  double accuracy;
  double loss_unc;
  double loss;
  int64_t idata_max;
  int64_t idata;
  int64_t batch_size;
  int64_t ibatch_j;
  int64_t j;
  int64_t bar_length;
  double *in_stack_ffffffffffffff10;
  double *in_stack_ffffffffffffff18;
  ggml_opt_result_t in_stack_ffffffffffffff20;
  char *local_d8;
  double *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff78;
  ggml_opt_result_t in_stack_ffffffffffffff80;
  undefined8 local_78;
  undefined8 local_70;
  long local_48;
  
  if ((in_DIL & 1) == 0) {
    local_d8 = "val:   ";
  }
  else {
    local_d8 = "train: ";
  }
  fprintf(_stderr,"%s[",local_d8);
  for (local_48 = 0; local_48 < 0x19; local_48 = local_48 + 1) {
    if ((in_R9 * local_48) / 0x19 < in_R8) {
      fprintf(_stderr,"=",(in_R9 * local_48) % 0x19);
    }
    else {
      lVar1 = in_R9 * (local_48 + -1);
      lVar7 = lVar1 % 0x19;
      if (lVar1 / 0x19 < in_R8) {
        fprintf(_stderr,">",lVar7);
      }
      else {
        fprintf(_stderr," ",lVar7);
      }
    }
  }
  pgVar2 = ggml_opt_inputs(in_RSI);
  lVar1 = pgVar2->ne[1];
  ggml_opt_result_loss
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ggml_opt_result_accuracy
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  iVar3 = ggml_time_us();
  lVar7 = (iVar3 - in_stack_00000008) / 1000000;
  lVar4 = lVar7 % 0xe10;
  lVar5 = (((iVar3 - in_stack_00000008) * (in_R9 - in_R8)) / in_R8) / 1000000;
  lVar6 = lVar5 % 0xe10;
  fprintf(_stderr,
          "| data=%06ld/%06ld, loss=%.6lf+-%.6lf, accuracy=%.2lf+-%.2lf%%, t=%02ld:%02ld:%02ld, ETA=%02ld:%02ld:%02ld]\r"
          ,local_70,local_78,(double)in_stack_ffffffffffffff80 * 100.0,
          (double)in_stack_ffffffffffffff78 * 100.0,in_R8 * lVar1,in_R9 * lVar1,lVar7 / 0xe10,
          lVar4 / 0x3c,lVar4 % 0x3c,lVar5 / 0xe10,lVar6 / 0x3c,lVar6 % 0x3c);
  if (in_R8 == in_R9) {
    fprintf(_stderr,"\n");
  }
  fflush(_stderr);
  return;
}

Assistant:

void ggml_opt_epoch_callback_progress_bar(
        bool               train,
        ggml_opt_context_t opt_ctx,
        ggml_opt_dataset_t dataset,
        ggml_opt_result_t  result,
        int64_t            ibatch,
        int64_t            ibatch_max,
        int64_t            t_start_us) {
    fprintf(stderr, "%s[", train ? "train: " : "val:   ");

    constexpr int64_t bar_length = 25;
    for (int64_t j = 0; j < bar_length; ++j) {
        const int64_t ibatch_j = ibatch_max * j/bar_length;
        if (ibatch_j < ibatch) {
            fprintf(stderr, "=");
        } else if (ibatch_max * (j - 1)/bar_length < ibatch) {
            fprintf(stderr, ">");
        } else {
            fprintf(stderr, " ");
        }
    }

    const int64_t batch_size = ggml_opt_inputs(opt_ctx)->ne[1];
    const int64_t idata      = ibatch*batch_size;
    const int64_t idata_max  = ibatch_max*batch_size;

    double loss;
    double loss_unc;
    ggml_opt_result_loss(result, &loss, &loss_unc);

    double accuracy;
    double accuracy_unc;
    ggml_opt_result_accuracy(result, &accuracy, &accuracy_unc);

    const int64_t t_ibatch_us = ggml_time_us() - t_start_us;
    int64_t t_ibatch_s = t_ibatch_us / 1000000;
    const int64_t t_ibatch_h = t_ibatch_s / 3600;
    t_ibatch_s -= t_ibatch_h * 3600;
    const int64_t t_ibatch_m = t_ibatch_s / 60;
    t_ibatch_s -= t_ibatch_m * 60;

    const int64_t t_eta_us = t_ibatch_us * (ibatch_max - ibatch)/ibatch;
    int64_t t_eta_s = t_eta_us / 1000000;
    const int64_t t_eta_h = t_eta_s / 3600;
    t_eta_s -= t_eta_h * 3600;
    const int64_t t_eta_m = t_eta_s / 60;
    t_eta_s -= t_eta_m * 60;

    fprintf(stderr, "| data=%06" PRId64 "/%06" PRId64 ", loss=%.6lf+-%.6lf, accuracy=%.2lf+-%.2lf%%, "
            "t=%02" PRId64 ":%02" PRId64 ":%02" PRId64 ", ETA=%02" PRId64 ":%02" PRId64 ":%02" PRId64 "]\r",
            idata, idata_max, loss, loss_unc, 100.0*accuracy, 100.0*accuracy_unc,
            t_ibatch_h, t_ibatch_m, t_ibatch_s, t_eta_h, t_eta_m, t_eta_s);
    if (ibatch == ibatch_max) {
        fprintf(stderr, "\n");
    }
    fflush(stderr);

    GGML_UNUSED(dataset);
}